

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::ComputeDefaultActions(POMDPX *this,string *type)

{
  pointer pVVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar3 = std::operator==(type,"MDP");
  if (bVar3) {
    (*(this->super_MDP)._vptr_MDP[6])(this);
    uVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar4);
    pVVar1 = (this->super_MDP).policy_.
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_start;
    piVar2 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 4 != uVar6; uVar6 = uVar6 + 4) {
      *(ACT_TYPE *)((long)piVar2 + uVar6) = (&pVVar1->action)[uVar6];
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
  poVar5 = std::operator<<(poVar5,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

void POMDPX::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<POMDPX*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}